

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

uint8_t * cfd::core::AllocWallyBuffer(uint8_t *source,size_t length)

{
  uint8_t *__dest;
  CfdException *pCVar1;
  int ret;
  wally_operations ops;
  int local_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_78._8_8_ = (code *)0x0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = 0;
  local_78._0_8_ = (char *)0x50;
  local_9c = wally_get_operations();
  if (local_9c != 0) {
    local_98._0_8_ = "cfdcore_psbt.cpp";
    local_98._8_4_ = 0x197;
    local_98._16_8_ = "AllocWallyBuffer";
    logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                      "wally_get_operations NG[{}]",&local_9c);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = local_98 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"OperationFunctions get error.","");
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)local_98);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  __dest = (uint8_t *)(*(code *)local_78._8_8_)(length);
  if (__dest != (uint8_t *)0x0) {
    memcpy(__dest,source,length);
    return __dest;
  }
  local_78._0_8_ = "cfdcore_psbt.cpp";
  local_78._8_4_ = 0x19e;
  local_68._M_allocated_capacity = 0x21e492;
  logger::log<>((CfdSourceLocation *)local_78,kCfdLogLevelWarning,"wally malloc NG.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_78._0_8_ = &local_68;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"malloc error.","");
  CfdException::CfdException(pCVar1,kCfdMemoryFullError,(string *)local_78);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint8_t *AllocWallyBuffer(const uint8_t *source, size_t length) {
  wally_malloc_t malloc_func = nullptr;

  int ret;
  if (malloc_func == nullptr) {
    struct wally_operations ops;
    memset(&ops, 0, sizeof(ops));
    ops.struct_size = sizeof(ops);
    ret = wally_get_operations(&ops);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_get_operations NG[{}]", ret);
      throw CfdException(kCfdInternalError, "OperationFunctions get error.");
    }
    malloc_func = ops.malloc_fn;
  }
  void *addr = malloc_func(length);
  if (addr == nullptr) {
    warn(CFD_LOG_SOURCE, "wally malloc NG.");
    throw CfdException(kCfdMemoryFullError, "malloc error.");
  }
  memcpy(addr, source, length);
  return static_cast<uint8_t *>(addr);
}